

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O2

void cfd::TransactionContextUtil::AddPubkeyHashSign<cfd::TransactionContext>
               (TransactionContext *transaction,OutPoint *outpoint,SignParameter *signature,
               Pubkey *pubkey,AddressType address_type)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  SignDataType SVar4;
  CfdException *pCVar5;
  AddressType address_type_local;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  SignParameter local_e0;
  Script locking_script;
  
  address_type_local = address_type;
  SVar4 = SignParameter::GetDataType(signature);
  if (SVar4 != kSign) {
    SVar4 = SignParameter::GetDataType(signature);
    if (SVar4 != kBinary) {
      local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
      local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = 100;
      local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
      locking_script._vptr_Script._0_4_ = SignParameter::GetDataType(signature);
      core::logger::warn<cfd::SignDataType>
                ((CfdSourceLocation *)&local_e0,
                 "Failed to AddPubkeyHashSign. Invalid signature type: {}",
                 (SignDataType *)&locking_script);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_e0,
                 "Invalid signature type. signature type must be \"kSign\" or \"kBinary\".",
                 (allocator *)&locking_script);
      core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_e0);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  cVar3 = cfd::core::Pubkey::IsValid();
  if (cVar3 != '\0') {
    cVar3 = cfd::core::OutPoint::IsValid();
    if (cVar3 == '\0') {
      local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
      local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = 0x71;
      local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
      core::logger::warn<>
                ((CfdSourceLocation *)&local_e0,"Failed to AddPubkeyHashSign. Invalid outpoint.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_e0,"Invalid outpoint.",(allocator *)&locking_script);
      core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_e0);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::Script::Script(&locking_script);
    sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (address_type == kP2pkhAddress) {
      bVar2 = true;
      bVar1 = false;
    }
    else if (address_type == kP2wpkhAddress) {
      bVar1 = true;
      bVar2 = false;
    }
    else {
      if (address_type != kP2shP2wpkhAddress) {
        local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
        local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x88;
        local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
        core::logger::warn<cfd::core::AddressType&>
                  ((CfdSourceLocation *)&local_e0,
                   "Failed to AddPubkeyHashSign. Invalid address_type: {}",&address_type_local);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_e0,
                   "Invalid address_type. address_type must be \"p2wpkh\" or \"p2sh-p2wpkh\" or \"p2pkh\"."
                   ,(allocator *)&scriptsig);
        core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_e0);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Pubkey *)&local_e0);
      cfd::core::Script::operator=(&locking_script,(Script *)&local_e0);
      core::Script::~Script((Script *)&local_e0);
      bVar1 = true;
      bVar2 = true;
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
              (&sign_params,signature);
    SignParameter::SignParameter(&local_e0,pubkey);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
    emplace_back<cfd::SignParameter>(&sign_params,&local_e0);
    SignParameter::~SignParameter(&local_e0);
    if (bVar1) {
      AddSign<cfd::TransactionContext>(transaction,outpoint,&sign_params,true,true);
    }
    if (bVar2) {
      cVar3 = cfd::core::Script::IsEmpty();
      if (cVar3 == '\0') {
        scriptsig.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        scriptsig.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        scriptsig.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SignParameter::SignParameter(&local_e0,&locking_script);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
        emplace_back<cfd::SignParameter>(&scriptsig,&local_e0);
        SignParameter::~SignParameter(&local_e0);
        AddSign<cfd::TransactionContext>(transaction,outpoint,&scriptsig,false,true);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&scriptsig);
      }
      else {
        AddSign<cfd::TransactionContext>(transaction,outpoint,&sign_params,false,true);
      }
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_params);
    core::Script::~Script(&locking_script);
    return;
  }
  local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
  local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x6d;
  local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
  core::logger::warn<>
            ((CfdSourceLocation *)&local_e0,"Failed to AddPubkeyHashSign. Invalid pubkey.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_e0,"Invalid pubkey.",(allocator *)&locking_script);
  core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_e0);
  __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddPubkeyHashSign(
    Tx* transaction, const OutPoint& outpoint, const SignParameter& signature,
    const Pubkey& pubkey, AddressType address_type) {
  if ((signature.GetDataType() != SignDataType::kSign) &&
      (signature.GetDataType() != SignDataType::kBinary)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddPubkeyHashSign. Invalid signature type: {}",
        signature.GetDataType());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid signature type. signature type must be \"kSign\" "
        "or \"kBinary\".");  // NOLINT
  }
  if (!pubkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddPubkeyHashSign. Invalid pubkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid pubkey.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddPubkeyHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wpkhAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wpkhAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
      break;
    case AddressType::kP2pkhAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddPubkeyHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wpkh\" "
          "or \"p2sh-p2wpkh\" or \"p2pkh\".");  // NOLINT
  }
  sign_params.push_back(signature);
  sign_params.push_back(SignParameter(pubkey));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, true);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, true);
    }
  }
}